

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_bs.c
# Opt level: O3

int jpc_bitstream_inalign(jpc_bitstream_t *bitstream,int fillmask,int filldata)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = bitstream->cnt_;
  if ((int)uVar3 < 1) {
    uVar4 = 0;
    if (uVar3 == 0) {
      uVar3 = 7;
      uVar5 = 0;
      if ((char)bitstream->buf_ == -1) goto LAB_00118f38;
    }
    else {
      uVar5 = 0;
    }
LAB_00118f71:
    if ((char)bitstream->buf_ == -1) {
      lVar1 = jpc_bitstream_getbits(bitstream,7);
      if ((int)(uint)lVar1 < 0) goto LAB_00118fa7;
      uVar4 = uVar4 << 7 | (uint)lVar1;
      uVar5 = uVar5 + 7;
    }
    if (uVar5 < 8) {
      bVar2 = 7 - (char)uVar5;
      filldata = filldata >> (bVar2 & 0x1f);
      fillmask = fillmask >> (bVar2 & 0x1f);
    }
    else {
      uVar4 = (int)uVar4 >> ((char)uVar5 - 7U & 0x1f);
    }
    uVar3 = (uint)(((filldata ^ uVar4) & fillmask) != 0);
  }
  else {
LAB_00118f38:
    lVar1 = jpc_bitstream_getbits(bitstream,uVar3);
    uVar4 = (uint)lVar1;
    uVar5 = uVar3;
    if (-1 < (int)uVar4) goto LAB_00118f71;
LAB_00118fa7:
    uVar3 = 0xffffffff;
  }
  return uVar3;
}

Assistant:

int jpc_bitstream_inalign(jpc_bitstream_t *bitstream, int fillmask,
  int filldata)
{
	int n;
	int v;
	int u;
	int numfill;
	int m;

	numfill = 7;
	m = 0;
	v = 0;
	if (bitstream->cnt_ > 0) {
		n = bitstream->cnt_;
	} else if (!bitstream->cnt_) {
		n = ((bitstream->buf_ & 0xff) == 0xff) ? 7 : 0;
	} else {
		n = 0;
	}
	if (n > 0) {
		if ((u = jpc_bitstream_getbits(bitstream, n)) < 0) {
			return -1;
		}
		m += n;
		v = (v << n) | u;
	}
	if ((bitstream->buf_ & 0xff) == 0xff) {
		if ((u = jpc_bitstream_getbits(bitstream, 7)) < 0) {
			return -1;
		}
		v = (v << 7) | u;
		m += 7;
	}
	if (m > numfill) {
		v >>= m - numfill;
	} else {
		filldata >>= numfill - m;
		fillmask >>= numfill - m;
	}
	if (((~(v ^ filldata)) & fillmask) != fillmask) {
		/* The actual fill pattern does not match the expected one. */
		return 1;
	}

	return 0;
}